

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decl.c
# Opt level: O0

void init_data(void)

{
  char *pcVar1;
  boolean bVar2;
  nh_autopickup_rules *pnVar3;
  nh_msgtype_rules *pnVar4;
  char cVar5;
  char *hp_notify_fmt;
  nh_msgtype_rules *mt_rules;
  nh_autopickup_rules *rules;
  boolean nolog;
  boolean in_restore;
  
  pnVar4 = iflags.mt_rules;
  pnVar3 = iflags.ap_rules;
  bVar2 = iflags.disable_log;
  pcVar1 = iflags.hp_notify_fmt;
  cVar5 = (char)program_state.restoring;
  moves = 1;
  memset(&program_state,0,0x28);
  memset(&flags,0,0xb0);
  memset(&iflags,0,0x40);
  memset(&quest_status,0,8);
  memset(levels,0,0x1000);
  memset(bases,0,0x48);
  memset(&u,0,0x630);
  memset(dogname,0,0x3f);
  memset(catname,0,0x3f);
  memset(horsename,0,0x3f);
  memset(monkeyname,0,0x3f);
  memset(wolfname,0,0x3f);
  memset(crocname,0,0x3f);
  memset(ratname,0,0x3f);
  memset(&youmonst,0,0x78);
  memset(&upermonst,0,0x40);
  memset(&zeroobj,0,0x68);
  memset(mvitals,0,0x4b9);
  memset(spl_book,0,0x160);
  memset(disco,0,0x434);
  memset(&digging,0,0x10);
  memset(&inv_pos,0,2);
  memset(multi_txt,0,0x100);
  memset(toplines,0,0x1e00);
  memset(toplines_count,0,0x78);
  level = (level *)0x0;
  killer_format = 0;
  delay_start = 0;
  occtime = 0;
  multi = 0;
  afternmv = (_func_int *)0x0;
  occupation = (_func_int *)0x0;
  killer = (char *)0x0;
  ffruit = (fruit *)0x0;
  current_fruit = 0;
  sp_levchn = (s_level *)0x0;
  mrg_to_wielded = '\0';
  unweapon = '\0';
  stoned = '\0';
  in_mklev = '\0';
  uball = (obj *)0x0;
  uchain = (obj *)0x0;
  ublindf = (obj *)0x0;
  uleft = (obj *)0x0;
  uright = (obj *)0x0;
  uamul = (obj *)0x0;
  uarmf = (obj *)0x0;
  uarmg = (obj *)0x0;
  uarms = (obj *)0x0;
  uarmh = (obj *)0x0;
  uarmc = (obj *)0x0;
  uskin = (obj *)0x0;
  uarmu = (obj *)0x0;
  uquiver = (obj *)0x0;
  uswapwep = (obj *)0x0;
  uarm = (obj *)0x0;
  uwep = (obj *)0x0;
  invent = (obj *)0x0;
  current_wand = (obj *)0x0;
  magic_chest_objs = (obj *)0x0;
  book = (obj *)0x0;
  in_steed_dismounting = '\0';
  wailmsg = 0;
  bhitpos.y = '\0';
  bhitpos.x = '\0';
  preferred_pet = '\0';
  mydogs = (monst *)0x0;
  migrating_mons = (monst *)0x0;
  vision_full_recalc = '\0';
  viz_array = (char **)0x0;
  artilist = (artifact *)0x0;
  stetho_last_used_movement = 0;
  stetho_last_used_move = -1;
  alchemy_init_done = '\0';
  branch_id = 0;
  histevents = (histevent *)0x0;
  histcount = 0;
  curline = 0;
  program_state.restoring = (int)cVar5;
  iflags.disable_log = bVar2;
  iflags.ap_rules = pnVar3;
  iflags.mt_rules = pnVar4;
  iflags.hp_notify_fmt = pcVar1;
  flags.moonphase = 10;
  lastinvnr = 0x33;
  flags.soundok = '\x01';
  return;
}

Assistant:

void init_data(void)
{
    boolean in_restore = program_state.restoring;
    
    /* iflags may already contain valid, important data, because init_data() runs
     * as part of the game init sequence after options have been set, etc. */
    boolean nolog = iflags.disable_log;
    struct nh_autopickup_rules *rules = iflags.ap_rules;
    struct nh_msgtype_rules *mt_rules = iflags.mt_rules;
    char *hp_notify_fmt = iflags.hp_notify_fmt;
    moves = 1;
    
    memset(&program_state, 0, sizeof(program_state));
    memset(&flags, 0, sizeof(flags));
    memset(&iflags, 0, sizeof(iflags));
    memset(&quest_status, 0, sizeof(quest_status));
    memset(&levels, 0, sizeof(levels));
    memset(bases, 0, sizeof(bases));
    memset(&u, 0, sizeof(u));
    memset(dogname, 0, sizeof(dogname));
    memset(catname, 0, sizeof(catname));
    memset(horsename, 0, sizeof(horsename));
    memset(monkeyname, 0, sizeof(monkeyname));
    memset(wolfname, 0, sizeof(wolfname));
    memset(crocname, 0, sizeof(crocname));
    memset(ratname, 0, sizeof(ratname));
    memset(&youmonst, 0, sizeof(youmonst));
    memset(&upermonst, 0, sizeof(upermonst));
    memset(&zeroobj, 0, sizeof(zeroobj));
    memset(mvitals, 0, sizeof(mvitals));
    memset(spl_book, 0, sizeof(spl_book));
    memset(disco, 0, sizeof(disco));
    memset(&digging, 0, sizeof(digging));
    memset(&inv_pos, 0, sizeof(inv_pos));
    memset(multi_txt, 0, sizeof(multi_txt));
    memset(toplines, 0, sizeof(toplines));
    memset(toplines_count, 0, sizeof(toplines_count));
    
    level = NULL;
    multi = occtime = delay_start = killer_format = 0;
    afternmv = NULL;
    occupation = NULL;
    killer = NULL;
    ffruit = NULL;
    current_fruit = 0;
    sp_levchn = NULL;
    in_mklev = stoned = unweapon = mrg_to_wielded = FALSE;
    current_wand = invent = uwep = uarm = uswapwep = uquiver = uarmu = uskin =
	uarmc = uarmh = uarms = uarmg = uarmf = uamul = uright = uleft =
	ublindf = uchain = uball = NULL;
    magic_chest_objs = NULL;
    book = NULL;
    in_steed_dismounting = FALSE;
    wailmsg = 0;
    bhitpos.x = bhitpos.y = 0;
    preferred_pet = 0;
    migrating_mons = mydogs = NULL;
    vision_full_recalc = FALSE;
    viz_array = NULL;
    artilist = NULL;
    stetho_last_used_movement = 0;
    stetho_last_used_move = -1;
    alchemy_init_done = FALSE;
    branch_id = 0;
    histevents = NULL;
    histcount = 0;
    curline = 0;
    
    program_state.restoring = in_restore;
    iflags.disable_log = nolog;
    iflags.ap_rules = rules;
    iflags.mt_rules = mt_rules;
    iflags.hp_notify_fmt = hp_notify_fmt;
    flags.moonphase = 10; /* invalid value, so that the first call to realtime_tasks will dtrt */
    lastinvnr = 51;
    flags.soundok = 1;
}